

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBOCache.cpp
# Opt level: O2

GLFrameBufferObj * __thiscall
Diligent::FBOCache::GetFBO
          (FBOCache *this,TextureBaseGL *pTex,Uint32 ArraySlice,Uint32 MipLevel,
          FRAMEBUFFER_TARGET_FLAGS Targets)

{
  int iVar1;
  GLenum GVar2;
  long lVar3;
  _Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
  _Var4;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false,_false>,_bool>
  pVar5;
  GLenum err;
  undefined4 uStack_22c;
  string msg;
  GLFrameBufferObj NewFBO;
  FBOCacheKey Key;
  
  lVar3 = (**(code **)((long)(pTex->super_TextureBase<Diligent::EngineGLImplTraits>).
                             super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                             .super_ObjectBase<Diligent::ITextureGL>.
                             super_RefCountedObject<Diligent::ITextureGL>.super_ITextureGL.
                             super_ITexture.super_IDeviceObject + 0x20))(pTex);
  FBOCacheKey::FBOCacheKey(&Key);
  Key.NumRenderTargets = 1;
  Key.RTIds[0] = DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                 ::GetUniqueID((DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                                *)pTex);
  Key.RTVDescs[0].Format = *(TEXTURE_FORMAT *)(lVar3 + 0x18);
  Key.RTVDescs[0].TextureDim = *(RESOURCE_DIMENSION *)(lVar3 + 8);
  Key.RTVDescs[0].ViewType =
       TEXTURE_VIEW_RENDER_TARGET -
       ((Targets & FRAMEBUFFER_TARGET_FLAG_DRAW) == FRAMEBUFFER_TARGET_FLAG_NONE);
  Key.RTVDescs[0].MostDetailedMip = MipLevel;
  Key.RTVDescs[0].field_5.FirstArraySlice = ArraySlice;
  Key.RTVDescs[0].field_6.NumArraySlices = 1;
  Threading::SpinLock::lock(&this->m_CacheLock);
  _Var4._M_cur = (__node_type *)
                 std::
                 _Hashtable<Diligent::FBOCache::FBOCacheKey,_std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_std::allocator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FBOCache::FBOCacheKey>,_Diligent::FBOCache::FBOCacheKeyHashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->m_Cache)._M_h,&Key);
  if (_Var4._M_cur == (__node_type *)0x0) {
    GLObjectWrappers::GLFrameBufferObj::GLFrameBufferObj(&NewFBO,true,(GLFBOCreateReleaseHelper)0x0)
    ;
    if ((Targets & FRAMEBUFFER_TARGET_FLAG_READ) != FRAMEBUFFER_TARGET_FLAG_NONE) {
      (*__glewBindFramebuffer)
                (0x8ca8,NewFBO.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
                        m_uiHandle);
      iVar1 = glGetError();
      _err = (char *)CONCAT44(uStack_22c,iVar1);
      if (iVar1 != 0) {
        LogError<false,char[43],char[17],unsigned_int>
                  (false,"GetFBO",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                   ,0x171,(char (*) [43])"Failed to bind new FBO as read framebuffer",
                   (char (*) [17])"\nGL Error Code: ",&err);
        FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"GetFBO",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                   ,0x171);
        std::__cxx11::string::~string((string *)&msg);
      }
    }
    if ((Targets & FRAMEBUFFER_TARGET_FLAG_DRAW) != FRAMEBUFFER_TARGET_FLAG_NONE) {
      (*__glewBindFramebuffer)
                (0x8ca9,NewFBO.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
                        m_uiHandle);
      iVar1 = glGetError();
      _err = (char *)CONCAT44(uStack_22c,iVar1);
      if (iVar1 != 0) {
        LogError<false,char[43],char[17],unsigned_int>
                  (false,"GetFBO",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                   ,0x176,(char (*) [43])"Failed to bind new FBO as draw framebuffer",
                   (char (*) [17])"\nGL Error Code: ",&err);
        FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"GetFBO",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                   ,0x176);
        std::__cxx11::string::~string((string *)&msg);
      }
    }
    GVar2 = GetFramebufferAttachmentPoint(*(TEXTURE_FORMAT *)(lVar3 + 0x18));
    (**(code **)((long)(pTex->super_TextureBase<Diligent::EngineGLImplTraits>).
                       super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                       .super_ObjectBase<Diligent::ITextureGL>.
                       super_RefCountedObject<Diligent::ITextureGL>.super_ITextureGL.super_ITexture.
                       super_IDeviceObject + 0x98))(pTex,Key.RTVDescs,GVar2,Targets);
    GVar2 = (*__glewCheckFramebufferStatus)(0x8ca8);
    if (GVar2 != 0x8cd5) {
      _err = GetFramebufferStatusString(GVar2);
      LogError<false,char[44],char_const*>
                (false,"GetFBO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                 ,0x180,(char (*) [44])"Read framebuffer is incomplete. FB status: ",(char **)&err);
      FormatString<char[31]>(&msg,(char (*) [31])"Read framebuffer is incomplete");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetFBO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                 ,0x181);
      std::__cxx11::string::~string((string *)&msg);
    }
    pVar5 = std::
            _Hashtable<Diligent::FBOCache::FBOCacheKey,std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>,std::allocator<std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>>,std::__detail::_Select1st,std::equal_to<Diligent::FBOCache::FBOCacheKey>,Diligent::FBOCache::FBOCacheKeyHashFunc,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<Diligent::FBOCache::FBOCacheKey&,GLObjectWrappers::GLFrameBufferObj>
                      ((_Hashtable<Diligent::FBOCache::FBOCacheKey,std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>,std::allocator<std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>>,std::__detail::_Select1st,std::equal_to<Diligent::FBOCache::FBOCacheKey>,Diligent::FBOCache::FBOCacheKeyHashFunc,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->m_Cache,&Key,&NewFBO);
    _Var4._M_cur = (__node_type *)
                   pVar5.first.
                   super__Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
                   ._M_cur;
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      FormatString<char[25]>(&msg,(char (*) [25])"New FBO was not inserted");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetFBO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                 ,0x187);
      std::__cxx11::string::~string((string *)&msg);
    }
    std::
    _Hashtable<int,std::pair<int_const,Diligent::FBOCache::FBOCacheKey>,std::allocator<std::pair<int_const,Diligent::FBOCache::FBOCacheKey>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
    ::_M_emplace<int&,Diligent::FBOCache::FBOCacheKey&>
              ((_Hashtable<int,std::pair<int_const,Diligent::FBOCache::FBOCacheKey>,std::allocator<std::pair<int_const,Diligent::FBOCache::FBOCacheKey>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                *)&this->m_TexIdToKey,Key.RTIds,&Key);
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::~GLObjWrapper
              (&NewFBO.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>);
  }
  Threading::SpinLock::unlock(&this->m_CacheLock);
  return (GLFrameBufferObj *)
         ((long)&((_Var4._M_cur)->
                 super__Hash_node_value<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
                 ).
                 super__Hash_node_value_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>_>
                 ._M_storage._M_storage + 0x1a8);
}

Assistant:

const GLObjectWrappers::GLFrameBufferObj& FBOCache::GetFBO(TextureBaseGL*                          pTex,
                                                           Uint32                                  ArraySlice,
                                                           Uint32                                  MipLevel,
                                                           TextureBaseGL::FRAMEBUFFER_TARGET_FLAGS Targets)
{
    const TextureDesc& TexDesc = pTex->GetDesc();

    FBOCacheKey Key;
    Key.NumRenderTargets = 1;
    Key.RTIds[0]         = pTex->GetUniqueID();

    TextureViewDesc& RTV0{Key.RTVDescs[0]};
    RTV0.Format     = TexDesc.Format;
    RTV0.TextureDim = TexDesc.Type;
    RTV0.ViewType   = (Targets & TextureBaseGL::FRAMEBUFFER_TARGET_FLAG_DRAW) ?
        TEXTURE_VIEW_RENDER_TARGET : // Also OK for depth attachments
        TEXTURE_VIEW_SHADER_RESOURCE;

    RTV0.FirstArraySlice = ArraySlice;
    RTV0.MostDetailedMip = MipLevel;
    RTV0.NumArraySlices  = 1;

    // Lock the cache
    Threading::SpinLockGuard CacheGuard{m_CacheLock};

    // Try to find FBO in the map
    auto fbo_it = m_Cache.find(Key);
    if (fbo_it == m_Cache.end())
    {
        // Create a new FBO
        GLObjectWrappers::GLFrameBufferObj NewFBO{true};

        if (Targets & TextureBaseGL::FRAMEBUFFER_TARGET_FLAG_READ)
        {
            glBindFramebuffer(GL_READ_FRAMEBUFFER, NewFBO);
            DEV_CHECK_GL_ERROR("Failed to bind new FBO as read framebuffer");
        }
        if (Targets & TextureBaseGL::FRAMEBUFFER_TARGET_FLAG_DRAW)
        {
            glBindFramebuffer(GL_DRAW_FRAMEBUFFER, NewFBO);
            DEV_CHECK_GL_ERROR("Failed to bind new FBO as draw framebuffer");
        }

        pTex->AttachToFramebuffer(RTV0, GetFramebufferAttachmentPoint(TexDesc.Format), Targets);

#ifdef DILIGENT_DEVELOPMENT
        GLenum Status = glCheckFramebufferStatus(GL_READ_FRAMEBUFFER);
        if (Status != GL_FRAMEBUFFER_COMPLETE)
        {
            const Char* StatusString = GetFramebufferStatusString(Status);
            LOG_ERROR("Read framebuffer is incomplete. FB status: ", StatusString);
            UNEXPECTED("Read framebuffer is incomplete");
        }
#endif

        auto it_inserted = m_Cache.emplace(Key, std::move(NewFBO));
        // New FBO must be actually inserted
        VERIFY(it_inserted.second, "New FBO was not inserted");
        m_TexIdToKey.emplace(Key.RTIds[0], Key);

        fbo_it = it_inserted.first;
    }
    return fbo_it->second;
}